

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase(FILE *out,TestCase *test_case)

{
  pointer ppTVar1;
  pointer ppTVar2;
  char *test_case_name;
  _Alloc_hider _Var3;
  uint uVar4;
  uint uVar5;
  TestInfo *test_info;
  TimeInMillis ms;
  int i;
  String local_1c8;
  stringstream stream;
  ostream local_1a8 [376];
  
  EscapeXmlAttribute((XmlUnitTestResultPrinter *)&stream,(test_case->name_).c_str_);
  _Var3._M_p = _stream;
  ppTVar1 = (test_case->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar2 = (test_case->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar4 = TestCase::failed_test_count(test_case);
  uVar5 = TestCase::disabled_test_count(test_case);
  fprintf((FILE *)out,"  <testsuite name=\"%s\" tests=\"%d\" failures=\"%d\" disabled=\"%d\" ",
          _Var3._M_p,(ulong)((long)ppTVar2 - (long)ppTVar1) >> 3 & 0xffffffff,(ulong)uVar4,
          (ulong)uVar5);
  String::~String((String *)&stream);
  FormatTimeInMillisAsSeconds_abi_cxx11_((string *)&stream,(internal *)test_case->elapsed_time_,ms);
  fprintf((FILE *)out,"errors=\"0\" time=\"%s\">\n",_stream);
  std::__cxx11::string::~string((string *)&stream);
  for (i = 0; i < (int)((ulong)((long)(test_case->test_info_list_).
                                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(test_case->test_info_list_).
                                     super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3); i = i + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    test_case_name = (test_case->name_).c_str_;
    test_info = TestCase::GetTestInfo(test_case,i);
    OutputXmlTestInfo(local_1a8,test_case_name,test_info);
    StringStreamToString((internal *)&local_1c8,&stream);
    fputs(local_1c8.c_str_,(FILE *)out);
    String::~String(&local_1c8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  fwrite("  </testsuite>\n",0xf,1,(FILE *)out);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(FILE* out,
                                                const TestCase& test_case) {
  fprintf(out,
          "  <testsuite name=\"%s\" tests=\"%d\" failures=\"%d\" "
          "disabled=\"%d\" ",
          EscapeXmlAttribute(test_case.name()).c_str(),
          test_case.total_test_count(),
          test_case.failed_test_count(),
          test_case.disabled_test_count());
  fprintf(out,
          "errors=\"0\" time=\"%s\">\n",
          FormatTimeInMillisAsSeconds(test_case.elapsed_time()).c_str());
  for (int i = 0; i < test_case.total_test_count(); ++i) {
    ::std::stringstream stream;
    OutputXmlTestInfo(&stream, test_case.name(), *test_case.GetTestInfo(i));
    fprintf(out, "%s", StringStreamToString(&stream).c_str());
  }
  fprintf(out, "  </testsuite>\n");
}